

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ym2612.cpp
# Opt level: O1

void __thiscall
LibGens::Ym2612Private::T_Update_Chan_LFO<6>
          (Ym2612Private *this,channel_t *CH,int32_t *bufL,int32_t *bufR,int length)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  
  if (0 < length &&
      (CH->_SLOT[2].Ecnt != 0x20000000 ||
      (CH->_SLOT[1].Ecnt != 0x20000000 || CH->_SLOT[3].Ecnt != 0x20000000))) {
    uVar21 = 0;
    do {
      iVar20 = CH->_SLOT[0].Fcnt;
      uVar1 = CH->_SLOT[1].Fcnt;
      iVar19 = CH->_SLOT[2].Fcnt;
      uVar16 = this->LFO_FREQ_UP[uVar21] * CH->FMS;
      if (uVar16 < 0x200) {
        CH->_SLOT[0].Fcnt = CH->_SLOT[0].Finc + iVar20;
        CH->_SLOT[2].Fcnt = CH->_SLOT[2].Finc + iVar19;
        CH->_SLOT[1].Fcnt = CH->_SLOT[1].Finc + uVar1;
        iVar17 = CH->_SLOT[3].Finc;
      }
      else {
        iVar18 = (int)uVar16 >> 9;
        iVar17 = CH->_SLOT[0].Finc;
        iVar2 = CH->_SLOT[1].Finc;
        CH->_SLOT[0].Fcnt = iVar17 + iVar20 + (iVar17 * iVar18 >> 9);
        iVar17 = CH->_SLOT[2].Finc;
        CH->_SLOT[2].Fcnt = iVar17 + iVar19 + (iVar17 * iVar18 >> 9);
        CH->_SLOT[1].Fcnt = (iVar2 * iVar18 >> 9) + uVar1 + iVar2;
        iVar17 = CH->_SLOT[3].Finc;
        iVar17 = (iVar18 * iVar17 >> 9) + iVar17;
      }
      uVar16 = CH->_SLOT[3].Fcnt;
      CH->_SLOT[3].Fcnt = iVar17 + uVar16;
      iVar17 = this->LFO_ENV_UP[uVar21];
      iVar2 = CH->_SLOT[0].TLL;
      iVar18 = CH->_SLOT[0].Ecnt;
      iVar3 = (&ENV_TAB)[iVar18 >> 0x10];
      iVar11 = CH->_SLOT[0].AMS;
      iVar4 = CH->_SLOT[2].TLL;
      iVar12 = CH->_SLOT[2].AMS;
      iVar5 = (&ENV_TAB)[*(short *)((long)&CH->_SLOT[2].Ecnt + 2)];
      iVar6 = CH->_SLOT[1].TLL;
      iVar7 = (&ENV_TAB)[*(short *)((long)&CH->_SLOT[1].Ecnt + 2)];
      iVar13 = CH->_SLOT[1].AMS;
      iVar8 = CH->_SLOT[3].TLL;
      iVar14 = CH->_SLOT[3].AMS;
      iVar9 = (&ENV_TAB)[*(short *)((long)&CH->_SLOT[3].Ecnt + 2)];
      iVar18 = iVar18 + CH->_SLOT[0].Einc;
      CH->_SLOT[0].Ecnt = iVar18;
      if (CH->_SLOT[0].Ecmp <= iVar18) {
        (**(code **)(ENV_NEXT_EVENT + (long)CH->_SLOT[0].Ecurp * 8))(CH->_SLOT);
      }
      iVar18 = CH->_SLOT[2].Ecnt + CH->_SLOT[2].Einc;
      CH->_SLOT[2].Ecnt = iVar18;
      if (CH->_SLOT[2].Ecmp <= iVar18) {
        (**(code **)(ENV_NEXT_EVENT + (long)CH->_SLOT[2].Ecurp * 8))(CH->_SLOT + 2);
      }
      iVar18 = CH->_SLOT[1].Ecnt + CH->_SLOT[1].Einc;
      CH->_SLOT[1].Ecnt = iVar18;
      if (CH->_SLOT[1].Ecmp <= iVar18) {
        (**(code **)(ENV_NEXT_EVENT + (long)CH->_SLOT[1].Ecurp * 8))(CH->_SLOT + 1);
      }
      iVar18 = CH->_SLOT[3].Ecnt + CH->_SLOT[3].Einc;
      CH->_SLOT[3].Ecnt = iVar18;
      if (CH->_SLOT[3].Ecmp <= iVar18) {
        (**(code **)(ENV_NEXT_EVENT + (long)CH->_SLOT[3].Ecurp * 8))(CH->_SLOT + 3);
      }
      iVar18 = CH->S0_OUT[0];
      iVar10 = CH->S0_OUT[1];
      iVar15 = CH->FB;
      CH->S0_OUT[1] = iVar18;
      iVar20 = *(int *)(*(long *)(SIN_TAB +
                                 ((uint)((iVar10 + iVar18 >> ((byte)iVar15 & 0x1f)) + iVar20) >> 0xb
                                 & 0x7ff8)) +
                       (long)(iVar2 + iVar3 + (iVar17 >> ((byte)iVar11 & 0x1f))) * 4);
      CH->S0_OUT[0] = iVar20;
      iVar19 = *(int *)(*(long *)(SIN_TAB + ((uint)(iVar19 + iVar20) >> 0xb & 0x7ff8)) +
                       (long)(iVar4 + iVar5 + (iVar17 >> ((byte)iVar12 & 0x1f))) * 4) +
               *(int *)(*(long *)(SIN_TAB + (uVar16 >> 0xb & 0x7ff8)) +
                       (long)(iVar8 + iVar9 + (iVar17 >> ((byte)iVar14 & 0x1f))) * 4) +
               *(int *)(*(long *)(SIN_TAB + (uVar1 >> 0xb & 0x7ff8)) +
                       (long)(iVar6 + iVar7 + (iVar17 >> ((byte)iVar13 & 0x1f))) * 4) >> 0xe;
      CH->OUTd = iVar19;
      iVar20 = LIMIT_CH_OUT;
      if ((LIMIT_CH_OUT < iVar19) ||
         (iVar20 = -LIMIT_CH_OUT, SBORROW4(iVar19,-LIMIT_CH_OUT) != iVar19 + LIMIT_CH_OUT < 0)) {
        CH->OUTd = iVar20;
      }
      bufL[uVar21] = bufL[uVar21] + ((CH->PANVolumeL * CH->OUTd) / 0xffff & CH->LEFT);
      bufR[uVar21] = bufR[uVar21] + ((CH->PANVolumeR * CH->OUTd) / 0xffff & CH->RIGHT);
      uVar21 = uVar21 + 1;
    } while ((uint)length != uVar21);
  }
  return;
}

Assistant:

inline void Ym2612Private::T_Update_Chan_LFO(channel_t *CH, int32_t *bufL, int32_t *bufR, int length)
{
	// Check if the channel has reached the end of the update.
	{
		int not_end = (CH->_SLOT[S3].Ecnt - ENV_END);

		// Special cases.
		// Copied from Game_Music_Emu v0.5.2.
		if (algo == 7)
			not_end |= (CH->_SLOT[S0].Ecnt - ENV_END);
		if (algo >= 5)
			not_end |= (CH->_SLOT[S2].Ecnt - ENV_END);
		if (algo >= 4)
			not_end |= (CH->_SLOT[S1].Ecnt - ENV_END);

		if (not_end == 0)
			return;
	}

	int env_LFO, freq_LFO;

//	LOG_MSG(ym2612, LOG_MSG_LEVEL_DEBUG2,
//		"Algo %d LFO len = %d", algo, length);

	for (int i = 0; i < length; i++) {
		int in0, in1, in2, in3;		// current phase calculation
		int en0, en1, en2, en3;		// current envelope calculation

		GET_CURRENT_PHASE();
		UPDATE_PHASE_LFO();
		GET_CURRENT_ENV_LFO();
		UPDATE_ENV();

		assert(algo >= 0 && algo <= 7);
		switch (algo) {
			case 0:
				DO_ALGO_0();
				break;
			case 1:
				DO_ALGO_1();
				break;
			case 2:
				DO_ALGO_2();
				break;
			case 3:
				DO_ALGO_3();
				break;
			case 4:
				DO_ALGO_4();
				break;
			case 5:
				DO_ALGO_5();
				break;
			case 6:
				DO_ALGO_6();
				break;
			case 7:
				DO_ALGO_7();
				break;
			default:
				break;
		}

		DO_OUTPUT();
	}
}